

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

box3f * __thiscall
pbrt::QuadMesh::getPrimBounds(box3f *__return_storage_ptr__,QuadMesh *this,size_t primID)

{
  (__return_storage_ptr__->lower).x = 3.4028235e+38;
  (__return_storage_ptr__->lower).y = 3.4028235e+38;
  *(undefined8 *)&(__return_storage_ptr__->lower).z = 0xff7fffff7f7fffff;
  (__return_storage_ptr__->upper).y = -3.4028235e+38;
  (__return_storage_ptr__->upper).z = -3.4028235e+38;
  math::box3f::extend(__return_storage_ptr__,
                      (this->vertex).
                      super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                      (this->index).
                      super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>.
                      _M_impl.super__Vector_impl_data._M_start[primID].x);
  math::box3f::extend(__return_storage_ptr__,
                      (this->vertex).
                      super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                      (this->index).
                      super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>.
                      _M_impl.super__Vector_impl_data._M_start[primID].y);
  math::box3f::extend(__return_storage_ptr__,
                      (this->vertex).
                      super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                      (this->index).
                      super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>.
                      _M_impl.super__Vector_impl_data._M_start[primID].z);
  math::box3f::extend(__return_storage_ptr__,
                      (this->vertex).
                      super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                      (this->index).
                      super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>.
                      _M_impl.super__Vector_impl_data._M_start[primID].w);
  return __return_storage_ptr__;
}

Assistant:

box3f QuadMesh::getPrimBounds(const size_t primID) 
  {
    box3f primBounds = box3f::empty_box();
    primBounds.extend(vertex[index[primID].x]);
    primBounds.extend(vertex[index[primID].y]);
    primBounds.extend(vertex[index[primID].z]);
    primBounds.extend(vertex[index[primID].w]);
    return primBounds;
  }